

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O0

void lyxml_correct_attr_ns(ly_ctx *ctx,lyxml_attr *attr,lyxml_elem *attr_parent,int copy_ns)

{
  lyxml_ns *plVar1;
  lyxml_attr *plVar2;
  lyxml_elem *local_40;
  lyxml_elem *attr_root;
  lyxml_elem *ns_root;
  lyxml_ns *tmp_ns;
  int copy_ns_local;
  lyxml_elem *attr_parent_local;
  lyxml_attr *attr_local;
  ly_ctx *ctx_local;
  
  if ((attr->type != LYXML_ATTR_NS) && (local_40 = attr_parent, attr->ns != (lyxml_ns *)0x0)) {
    for (; local_40->parent != (lyxml_elem *)0x0; local_40 = local_40->parent) {
    }
    for (attr_root = attr->ns->parent; attr_root->parent != (lyxml_elem *)0x0;
        attr_root = attr_root->parent) {
    }
    if (attr_root != local_40) {
      if (copy_ns == 0) {
        attr->ns = (lyxml_ns *)0x0;
      }
      else {
        plVar2 = (lyxml_attr *)attr->ns;
        plVar1 = lyxml_get_ns(attr_parent,plVar2->name);
        attr->ns = plVar1;
        if (attr->ns == (lyxml_ns *)0x0) {
          plVar2 = lyxml_dup_attr(ctx,attr_parent,plVar2);
          attr->ns = (lyxml_ns *)plVar2;
        }
      }
    }
  }
  return;
}

Assistant:

static void
lyxml_correct_attr_ns(struct ly_ctx *ctx, struct lyxml_attr *attr, struct lyxml_elem *attr_parent, int copy_ns)
{
    const struct lyxml_ns *tmp_ns;
    struct lyxml_elem *ns_root, *attr_root;

    if ((attr->type != LYXML_ATTR_NS) && attr->ns) {
        /* find the root of attr */
        for (attr_root = attr_parent; attr_root->parent; attr_root = attr_root->parent);

        /* find the root of attr NS */
        for (ns_root = attr->ns->parent; ns_root->parent; ns_root = ns_root->parent);

        /* attr NS is defined outside attr parent subtree */
        if (ns_root != attr_root) {
            if (copy_ns) {
                tmp_ns = attr->ns;
                /* we may have already copied the NS over? */
                attr->ns = lyxml_get_ns(attr_parent, tmp_ns->prefix);

                /* we haven't copied it over, copy it now */
                if (!attr->ns) {
                    attr->ns = (struct lyxml_ns *)lyxml_dup_attr(ctx, attr_parent, (struct lyxml_attr *)tmp_ns);
                }
            } else {
                attr->ns = NULL;
            }
        }
    }
}